

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O0

void PrintEscapedTypeName(ExpressionTranslateContext *ctx,TypeBase *type)

{
  TypeClass *pTVar1;
  TypeClass *typeClass;
  TypeBase *type_local;
  ExpressionTranslateContext *ctx_local;
  
  pTVar1 = getType<TypeClass>(type);
  if (pTVar1 == (TypeClass *)0x0) {
    PrintEscapedName(ctx,type->name);
  }
  else {
    if (pTVar1->scope->ownerFunction == (FunctionData *)0x0) {
      if ((((pTVar1->scope != ctx->ctx->globalScope) &&
           (pTVar1->scope->ownerType == (TypeBase *)0x0)) &&
          (pTVar1->scope->ownerFunction == (FunctionData *)0x0)) &&
         (pTVar1->scope->ownerNamespace == (NamespaceData *)0x0)) {
        Print(ctx,"scope_%d_",(ulong)pTVar1->scope->uniqueId);
      }
    }
    else {
      TranslateFunctionName(ctx,pTVar1->scope->ownerFunction);
      Print(ctx,"_");
    }
    PrintEscapedName(ctx,(pTVar1->super_TypeStruct).super_TypeBase.name);
  }
  return;
}

Assistant:

void PrintEscapedTypeName(ExpressionTranslateContext &ctx, TypeBase *type)
{
	if(TypeClass *typeClass = getType<TypeClass>(type))
	{
		if(typeClass->scope->ownerFunction)
		{
			TranslateFunctionName(ctx, typeClass->scope->ownerFunction);
			Print(ctx, "_");
		}
		else if(typeClass->scope != ctx.ctx.globalScope && !typeClass->scope->ownerType && !typeClass->scope->ownerFunction && !typeClass->scope->ownerNamespace)
		{
			Print(ctx, "scope_%d_", typeClass->scope->uniqueId);
		}

		PrintEscapedName(ctx, typeClass->name);
	}
	else
	{
		PrintEscapedName(ctx, type->name);
	}
}